

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall
cmCTestBuildHandler::LaunchHelper::LaunchHelper(LaunchHelper *this,cmCTestBuildHandler *handler)

{
  cmCTest *this_00;
  cmCTestBuildHandler *pcVar1;
  byte bVar2;
  string *source;
  string launchEnv;
  string tag;
  string sStack_78;
  string local_58;
  string local_38;
  
  this->Handler = handler;
  this_00 = (handler->super_cmCTestGenericHandler).CTest;
  this->CTest = this_00;
  cmCTest::GetCurrentTag_abi_cxx11_(&local_38,this_00);
  pcVar1 = this->Handler;
  if (local_38._M_string_length == 0) {
    pcVar1->UseCTestLaunch = false;
  }
  else {
    cmCTest::GetBinaryDir_abi_cxx11_(&local_58,this->CTest);
    cmStrCat<std::__cxx11::string,char_const(&)[10],std::__cxx11::string&,char_const(&)[7]>
              (&sStack_78,&local_58,(char (*) [10])"/Testing/",&local_38,(char (*) [7])"/Build");
    source = &pcVar1->CTestLaunchDir;
    std::__cxx11::string::operator=((string *)source,(string *)&sStack_78);
    std::__cxx11::string::~string((string *)&sStack_78);
    std::__cxx11::string::~string((string *)&local_58);
    cmsys::SystemTools::RemoveADirectory(source);
    bVar2 = this->Handler->UseCTestLaunch;
    if ((bool)bVar2 == true) {
      cmsys::SystemTools::MakeDirectory(source,(mode_t *)0x0);
      WriteLauncherConfig(this);
      cmStrCat<char_const(&)[19],std::__cxx11::string&>
                (&sStack_78,(char (*) [19])"CTEST_LAUNCH_LOGS=",source);
      cmsys::SystemTools::PutEnv(&sStack_78);
      std::__cxx11::string::~string((string *)&sStack_78);
      bVar2 = this->Handler->UseCTestLaunch;
    }
    if ((bVar2 & 1) != 0) goto LAB_001baec9;
  }
  cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
LAB_001baec9:
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

cmCTestBuildHandler::LaunchHelper::LaunchHelper(cmCTestBuildHandler* handler)
  : Handler(handler)
  , CTest(handler->CTest)
{
  std::string tag = this->CTest->GetCurrentTag();
  if (tag.empty()) {
    // This is not for a dashboard submission, so there is no XML.
    // Skip enabling the launchers.
    this->Handler->UseCTestLaunch = false;
  } else {
    // Compute a directory in which to store launcher fragments.
    std::string& launchDir = this->Handler->CTestLaunchDir;
    launchDir =
      cmStrCat(this->CTest->GetBinaryDir(), "/Testing/", tag, "/Build");

    // Clean out any existing launcher fragments.
    cmSystemTools::RemoveADirectory(launchDir);

    if (this->Handler->UseCTestLaunch) {
      // Enable launcher fragments.
      cmSystemTools::MakeDirectory(launchDir);
      this->WriteLauncherConfig();
      std::string launchEnv = cmStrCat("CTEST_LAUNCH_LOGS=", launchDir);
      cmSystemTools::PutEnv(launchEnv);
    }
  }

  // If not using launchers, make sure they passthru.
  if (!this->Handler->UseCTestLaunch) {
    cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
  }
}